

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O1

void builder_move_assign_after_releaseraw_test<TestHeapBuilder>(TestHeapBuilder *b1)

{
  uint val;
  bool val_00;
  Offset<MyGame::Example::Monster> OVar1;
  shared_ptr<unsigned_char> raw;
  size_t offset;
  size_t size;
  TestHeapBuilder src;
  string local_d8;
  uint8_t *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  size_t local_a8;
  size_t local_a0;
  FlatBufferBuilder local_98;
  
  OVar1 = populate1(&b1->super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish
            (&b1->super_FlatBufferBuilder,OVar1.o,(char *)0x0,false);
  local_b8 = flatbuffers::FlatBufferBuilderImpl<false>::ReleaseRaw
                       (&b1->super_FlatBufferBuilder,&local_a0,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,builder_move_assign_after_releaseraw_test<TestHeapBuilder>(TestHeapBuilder)::_lambda(unsigned_char*)_1_,std::allocator<void>,void>
            (&local_b0,local_b8,local_a0);
  local_98.buf_.allocator_ = (Allocator *)operator_new(8);
  (local_98.buf_.allocator_)->_vptr_Allocator = (_func_int **)&PTR__Allocator_00201c00;
  local_98.buf_.own_allocator_ = true;
  local_98.buf_.initial_size_ = 0x800;
  local_98.buf_.max_size_ = 0x7fffffff;
  local_98.buf_.buffer_minalign_ = 8;
  local_98.buf_.reserved_ = 0;
  local_98.buf_.size_ = 0;
  local_98.length_of_64_bit_region_ = 0;
  local_98.nested = false;
  local_98.finished = false;
  local_98.buf_.buf_ = (uint8_t *)0x0;
  local_98.buf_.cur_._0_6_ = 0;
  local_98.buf_.cur_._6_2_ = 0;
  local_98.buf_.scratch_._0_6_ = 0;
  local_98._78_8_ = 0;
  local_98.minalign_ = 1;
  local_98.force_defaults_ = false;
  local_98.dedup_vtables_ = true;
  local_98.string_pool = (StringOffsetMap *)0x0;
  OVar1 = populate2(&local_98);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish(&local_98,OVar1.o,(char *)0x0,false);
  val = local_98.buf_.size_;
  flatbuffers::FlatBufferBuilderImpl<false>::operator=(&b1->super_FlatBufferBuilder,&local_98);
  TestEq<unsigned_int,unsigned_int>
            ((b1->super_FlatBufferBuilder).buf_.size_,val,"\'b1.GetSize()\' != \'src_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x48,
             "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]");
  local_d8.field_2._M_allocated_capacity._0_4_ = 0x706d49;
  local_d8._M_string_length = 3;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  val_00 = release_n_verify(&b1->super_FlatBufferBuilder,&local_d8,Color_Green);
  TestEq<bool,bool>(true,val_00,"\'true\' != \'release_n_verify(b1, m2_name(), m2_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0x49,
                    "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]"
                   );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  TestEq<unsigned_int,int>
            (local_98.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x4a,
             "void builder_move_assign_after_releaseraw_test(Builder) [Builder = TestHeapBuilder]");
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_98);
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
  return;
}

Assistant:

void builder_move_assign_after_releaseraw_test(Builder b1) {
  auto root_offset1 = populate1(b1);
  b1.Finish(root_offset1);
  size_t size, offset;

  uint8_t *rr = b1.ReleaseRaw(size, offset);
  std::shared_ptr<uint8_t> raw(
      rr, [size](uint8_t *ptr) {
        flatbuffers::DefaultAllocator::dealloc(ptr, size);
      });
  Builder src;
  auto root_offset2 = populate2(src);
  src.Finish(root_offset2);
  auto src_size = src.GetSize();
  // Move into a released builder.
  b1 = std::move(src);
  TEST_EQ_FUNC(b1.GetSize(), src_size);
  TEST_ASSERT_FUNC(release_n_verify(b1, m2_name(), m2_color()));
  TEST_EQ_FUNC(src.GetSize(), 0);
}